

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_method_post.c
# Opt level: O0

char * nhr_request_create_url_encoded_parameters_POST(nhr_request r,size_t *parameters_len)

{
  nhr_request mem;
  nhr_request local_68;
  nhr_request local_60;
  char *params;
  void *zgip_parameters;
  size_t zgip_parameters_size;
  char content_length [24];
  void *local_28;
  size_t params_len;
  size_t *parameters_len_local;
  nhr_request r_local;
  
  local_28 = (void *)0x0;
  zgip_parameters = (void *)0x0;
  params_len = (size_t)parameters_len;
  parameters_len_local = (size_t *)r;
  if (r->parameters == (_nhr_map_node *)0x0) {
    local_68 = (nhr_request)0x0;
  }
  else {
    local_68 = (nhr_request)nhr_request_url_encoded_parameters(r->parameters,(size_t *)&local_28);
  }
  local_60 = local_68;
  if (local_68 == (nhr_request)0x0) {
    *(undefined8 *)params_len = 0;
    r_local = (nhr_request)0x0;
  }
  else {
    if (((char)parameters_len_local[0x12] != '\0') ||
       (*(char *)((long)parameters_len_local + 0x91) != '\0')) {
      mem = (nhr_request)
            nhr_gz_compress(local_68,(size_t)local_28,(size_t *)&zgip_parameters,
                            (char)parameters_len_local[0x12] != '\0');
      if ((mem == (nhr_request)0x0) || (zgip_parameters == (void *)0x0)) {
        nhr_free(mem);
      }
      else {
        nhr_free(local_68);
        local_28 = zgip_parameters;
        local_60 = mem;
      }
    }
    sprintf((char *)&zgip_parameters_size,"%lu",local_28);
    nhr_request_add_header_field
              ((nhr_request)parameters_len_local,k_nhr_content_type,
               k_nhr_application_x_www_form_urlencoded);
    nhr_request_add_header_field
              ((nhr_request)parameters_len_local,k_nhr_content_length,(char *)&zgip_parameters_size)
    ;
    *(void **)params_len = local_28;
    r_local = local_60;
  }
  return (char *)r_local;
}

Assistant:

char * nhr_request_create_url_encoded_parameters_POST(nhr_request r, size_t * parameters_len) {
    size_t params_len = 0;
    char content_length[24];
#if defined(NHR_GZIP)
    size_t zgip_parameters_size = 0;
    void * zgip_parameters = NULL;
#endif
    
    char * params = r->parameters ? nhr_request_url_encoded_parameters(r->parameters, &params_len) : NULL;
    if (!params) {
        *parameters_len = 0;
        return NULL;
    }
    
#if defined(NHR_GZIP)
    if (r->is_gziped || r->is_deflated) {
        zgip_parameters = nhr_gz_compress(params, params_len, &zgip_parameters_size, r->is_gziped ? NHR_GZ_METHOD_GZIP : NHR_GZ_METHOD_DEFLATE);
        if (zgip_parameters && zgip_parameters_size) {
            nhr_free(params);
            params_len = zgip_parameters_size;
            params = zgip_parameters;
        } else {
            nhr_free(zgip_parameters);
        }
    }
#endif
    
    nhr_sprintf(content_length, 24, "%lu", (unsigned long)params_len);
    nhr_request_add_header_field(r, k_nhr_content_type, k_nhr_application_x_www_form_urlencoded);
    nhr_request_add_header_field(r, k_nhr_content_length, content_length);
    
    *parameters_len = params_len;
    return params;
}